

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tree_data.c
# Opt level: O0

int lyd_merge_parent_children(lyd_node *target,lyd_node *source,int options)

{
  ly_ctx *ctx_00;
  lyd_node *plVar1;
  int iVar2;
  LY_ERR *pLVar3;
  ly_ctx *ctx;
  lyd_node *trg_parent_backup;
  lyd_node *trg_child;
  lyd_node *src_next;
  lyd_node *src_elem_backup;
  lyd_node *src_elem;
  lyd_node *src_backup;
  lyd_node *src;
  lyd_node *trg_parent;
  lyd_node *plStack_20;
  int options_local;
  lyd_node *source_local;
  lyd_node *target_local;
  
  ctx_00 = target->schema->module->ctx;
  plVar1 = source;
  plStack_20 = source;
  do {
    src_backup = plVar1;
    if (src_backup == (lyd_node *)0x0) {
      lyd_free_withsiblings(plStack_20);
      return 0;
    }
    plVar1 = src_backup->next;
    src_elem_backup = src_backup;
    src = target;
    while (src_elem_backup != (lyd_node *)0x0) {
      if (((src_elem_backup->field_0x9 & 1) == 0) || ((options & 0x100U) == 0)) {
        for (trg_parent_backup = src->child; trg_parent_backup != (lyd_node *)0x0;
            trg_parent_backup = trg_parent_backup->next) {
          iVar2 = lyd_merge_node_equal(trg_parent_backup,src_elem_backup);
          if (iVar2 != 0) {
            if ((trg_parent_backup->schema->nodetype & (LYS_ANYDATA|LYS_LEAF)) != LYS_UNKNOWN) {
              lyd_merge_node_update(trg_parent_backup,src_elem_backup);
            }
            break;
          }
          pLVar3 = ly_errno_location();
          if (*pLVar3 != LY_SUCCESS) {
            return 1;
          }
        }
        src_next = src_elem_backup;
        ctx = (ly_ctx *)src;
        if ((((src_elem_backup->schema->nodetype & (LYS_LIST|LYS_CONTAINER)) == LYS_UNKNOWN) ||
            (src_elem_backup->child == (lyd_node *)0x0)) || (trg_parent_backup == (lyd_node *)0x0))
        goto LAB_0018a083;
        trg_child = src_elem_backup->child;
        src = trg_parent_backup;
LAB_0018a0d4:
        while ((trg_child == (lyd_node *)0x0 &&
               (src_elem_backup = src_elem_backup->parent,
               src_elem_backup->parent != src_backup->parent))) {
          trg_child = src_elem_backup->next;
          src = src->parent;
        }
        if (trg_parent_backup == (lyd_node *)0x0) goto LAB_0018a12b;
      }
      else {
        if (src_elem_backup == src_backup) break;
        trg_parent_backup = (lyd_node *)0x1;
LAB_0018a083:
        if (src_elem_backup != src_backup) {
          trg_child = src_elem_backup->next;
          goto LAB_0018a0d4;
        }
        if ((src_elem_backup->schema->nodetype == LYS_CONTAINER) ||
           (((src_elem_backup->schema->nodetype & (LYS_ANYDATA|LYS_LEAF)) != LYS_UNKNOWN &&
            (trg_parent_backup != (lyd_node *)0x0)))) break;
        trg_child = (lyd_node *)0x0;
LAB_0018a12b:
        if (ctx_00 == src_next->schema->module->ctx) {
          lyd_unlink(src_next);
        }
        else {
          src_next = lyd_dup_to_ctx(src_next,1,ctx_00);
        }
        iVar2 = lyd_insert((lyd_node *)ctx,src_next);
        if (iVar2 != 0) {
          pLVar3 = ly_errno_location();
          *pLVar3 = LY_EINT;
          ly_log(LY_LLERR,"Internal error (%s:%d).",
                 "/workspace/llm4binary/github/license_all_cmakelists_25/RIFTIO[P]libyang/src/tree_data.c"
                 ,0x804);
          lyd_free_withsiblings(plStack_20);
          return 1;
        }
        if (src_elem_backup == src_backup) {
          if (plStack_20 == src_backup) {
            plStack_20 = plStack_20->next;
          }
          break;
        }
      }
      src_elem_backup = trg_child;
    }
  } while( true );
}

Assistant:

static int
lyd_merge_parent_children(struct lyd_node *target, struct lyd_node *source, int options)
{
    struct lyd_node *trg_parent, *src, *src_backup, *src_elem, *src_elem_backup, *src_next, *trg_child, *trg_parent_backup;
    struct ly_ctx *ctx = target->schema->module->ctx; /* shortcut */

    LY_TREE_FOR_SAFE(source, src_backup, src) {
        for (src_elem = src_next = src, trg_parent = target;
            src_elem;
            src_elem = src_next) {

            /* it won't get inserted in this case */
            if (src_elem->dflt && (options & LYD_OPT_EXPLICIT)) {
                if (src_elem == src) {
                    /* we are done with this subtree in this case */
                    break;
                }
                trg_child = (struct lyd_node *)1;
                goto src_skip;
            }

            LY_TREE_FOR(trg_parent->child, trg_child) {
                /* schema match, data match? */
                if (lyd_merge_node_equal(trg_child, src_elem)) {
                    if (trg_child->schema->nodetype & (LYS_LEAF | LYS_ANYDATA)) {
                        lyd_merge_node_update(trg_child, src_elem);
                    }
                    break;
                } else if (ly_errno) {
                    return EXIT_FAILURE;
                }
            }

            /* first prepare for the next iteration */
            src_elem_backup = src_elem;
            trg_parent_backup = trg_parent;
            if ((src_elem->schema->nodetype & (LYS_CONTAINER | LYS_LIST)) && src_elem->child && trg_child) {
                /* go into children */
                src_next = src_elem->child;
                trg_parent = trg_child;
            } else {
src_skip:
                /* no children (or the whole subtree will be inserted), try siblings */
                if (src_elem == src) {
                    /* we are done, src has no children ... */
                    if ((src_elem->schema->nodetype == LYS_CONTAINER)
                        || ((src_elem->schema->nodetype & (LYS_LEAF | LYS_ANYDATA)) && trg_child)) {
                        /* and it's a container (empty one) or an already-updated leaf/anydata, nothing else to do */
                        break;
                    } else {
                        /* ... but we still need to insert it */
                        src_next = NULL;
                        goto src_insert;
                    }
                } else {
                    src_next = src_elem->next;
                    /* trg_parent does not change */
                }
            }
            while (!src_next) {
                src_elem = src_elem->parent;
                if (src_elem->parent == src->parent) {
                    /* we are done, no next element to process */
                    break;
                }

                /* parent is already processed, go to its sibling */
                src_next = src_elem->next;
                trg_parent = trg_parent->parent;
            }

            if (!trg_child) {
src_insert:
                /* we need to insert the whole subtree */
                if (ctx == src_elem_backup->schema->module->ctx) {
                    /* same context - unlink the subtree and insert it into the target */
                    lyd_unlink(src_elem_backup);
                } else {
                    /* different contexts - before inserting subtree, instead of unlinking, duplicate it into the
                     * target context */
                    src_elem_backup = lyd_dup_to_ctx(src_elem_backup, 1, ctx);
                }

                /* insert subtree into the target */
                if (lyd_insert(trg_parent_backup, src_elem_backup)) {
                    LOGINT;
                    lyd_free_withsiblings(source);
                    return EXIT_FAILURE;
                }
                if (src_elem == src) {
                    /* we are finished for this src, we spent it, so forget the pointer if available */
                    if (source == src) {
                        source = source->next;
                    }
                    break;
                }
            }
        }
    }

    lyd_free_withsiblings(source);
    return EXIT_SUCCESS;
}